

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRelationship::~IfcRelationship(IfcRelationship *this)

{
  ~IfcRelationship(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

IfcRelationship() : Object("IfcRelationship") {}